

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShadedG(char *label_id,_func_ImPlotPoint_void_ptr_int *g1,void *data1,
                        _func_ImPlotPoint_void_ptr_int *g2,void *data2,int count,int offset)

{
  undefined1 local_68 [8];
  GetterFuncPtr getter2;
  GetterFuncPtr getter1;
  int count_local;
  void *data2_local;
  _func_ImPlotPoint_void_ptr_int *g2_local;
  void *data1_local;
  _func_ImPlotPoint_void_ptr_int *g1_local;
  char *label_id_local;
  
  GetterFuncPtr::GetterFuncPtr((GetterFuncPtr *)&getter2.Count,g1,data1,count,offset);
  GetterFuncPtr::GetterFuncPtr((GetterFuncPtr *)local_68,g2,data2,count,offset);
  PlotShadedEx<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr>
            (label_id,(GetterFuncPtr *)&getter2.Count,(GetterFuncPtr *)local_68,true);
  return;
}

Assistant:

void PlotShadedG(const char* label_id, ImPlotPoint (*g1)(void* data, int idx), void* data1, ImPlotPoint (*g2)(void* data, int idx), void* data2, int count, int offset) {
    GetterFuncPtr getter1(g1, data1, count, offset);
    GetterFuncPtr getter2(g2, data2, count, offset);
    PlotShadedEx(label_id, getter1, getter2, true);
}